

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client.cpp
# Opt level: O0

void libclient::main_client_thread(void)

{
  bind_t<void,_void_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_boost::_bi::list1<boost::_bi::value<char_*>_>_>
  threadfunc;
  int local_1cc;
  subsecond_duration<boost::posix_time::time_duration,_1000L> local_1c8 [3];
  bind_t<void,_void_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_boost::_bi::list1<boost::_bi::value<char_*>_>_>
  local_1b0;
  char ***local_1a0;
  char **name;
  char *names [7];
  undefined1 local_158 [8];
  thread_group threads;
  
  boost::thread_group::thread_group((thread_group *)local_158);
  memcpy(&name,&PTR_anon_var_dwarf_2b775_0014dac0,0x38);
  for (local_1a0 = &name; *local_1a0 != (char **)0x0; local_1a0 = local_1a0 + 1) {
    threadfunc = boost::bind<void,std::__cxx11::string_const&,char*>
                           (client_thread,(char *)*local_1a0);
    local_1b0 = threadfunc;
    boost::thread_group::
    create_thread<boost::_bi::bind_t<void,void(*)(std::__cxx11::string_const&),boost::_bi::list1<boost::_bi::value<char*>>>>
              ((thread_group *)local_158,threadfunc);
    local_1cc = 100;
    boost::date_time::subsecond_duration<boost::posix_time::time_duration,_1000L>::
    subsecond_duration<int>(local_1c8,&local_1cc,(type *)0x0);
    boost::this_thread::
    sleep<boost::date_time::subsecond_duration<boost::posix_time::time_duration,1000l>>(local_1c8);
  }
  boost::thread_group::join_all((thread_group *)local_158);
  boost::thread_group::~thread_group((thread_group *)local_158);
  return;
}

Assistant:

void libclient::main_client_thread() {
    boost::thread_group threads;
    char* names[] = { "Amul", "Macho", "SodaWater", "DesiBoy", "Jethalal", "Gyanchand",0 };
    for ( char ** name = names; *name; ++name) 
    {
        threads.create_thread( boost::bind(client_thread, *name));
        boost::this_thread::sleep( boost::posix_time::millisec(100));
    }
    threads.join_all();
}